

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::updateLayout(QWizardPrivate *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QVBoxLayout *pQVar4;
  QWizardHeader *this_00;
  QLabel *pQVar5;
  bool bVar6;
  undefined4 uVar7;
  uint uVar8;
  QWidget *this_01;
  QLayout *pQVar9;
  long *plVar10;
  QSpacerItem *this_02;
  WizardPixmap which;
  Policy vPolicy;
  long in_FS_OFFSET;
  QPixmap local_e8 [24];
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  QString local_b8;
  QString local_98;
  QWizardLayoutInfo info;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  info._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  layoutInfoForCurrentPage(&info,this);
  bVar6 = QWizardLayoutInfo::operator==(&this->layoutInfo,&info);
  if (!bVar6) {
    recreateLayout(this,&info);
  }
  lVar3 = *(long *)(lVar2 + 8);
  local_b8.d.d = (Data *)CONCAT44(local_b8.d.d._4_4_,*(undefined4 *)(lVar3 + 0x340));
  local_98.d.d = (Data *)0x0;
  this_01 = &QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(lVar3 + 0x2e0),(int *)&local_b8,
                        (QWizardPage **)&local_98)->super_QWidget;
  if (this_01 != (QWidget *)0x0) {
    pQVar9 = QWidget::layout(this_01);
    bVar6 = pQVar9 == (QLayout *)0x0;
    if (!bVar6) {
      pQVar4 = this->pageVBoxLayout;
      uVar7 = (**(code **)(*(long *)&(pQVar4->super_QBoxLayout).super_QLayout + 0xb8))
                        (pQVar4,this_01);
      plVar10 = (long *)(**(code **)(*(long *)&(pQVar4->super_QBoxLayout).super_QLayout + 0xa8))
                                  (pQVar4,uVar7);
      uVar8 = (**(code **)(*plVar10 + 0x28))(plVar10);
      bVar6 = SUB41((uVar8 & 2) >> 1,0);
    }
    pQVar4 = this->pageVBoxLayout;
    (**(code **)(*(long *)&(pQVar4->super_QBoxLayout).super_QLayout + 200))(pQVar4);
    plVar10 = (long *)(**(code **)(*(long *)&(pQVar4->super_QBoxLayout).super_QLayout + 0xa8))
                                (pQVar4);
    this_02 = (QSpacerItem *)(**(code **)(*plVar10 + 0x78))(plVar10);
    vPolicy = MinimumExpanding;
    if (bVar6 != false) {
      vPolicy = Ignored;
    }
    QSpacerItem::changeSize(this_02,0,0,Ignored,vPolicy);
    (**(code **)(*(long *)&(this->pageVBoxLayout->super_QBoxLayout).super_QLayout + 0x70))();
  }
  which = (WizardPixmap)this_01;
  if (info.header == true) {
    this_00 = this->headerWidget;
    lVar3 = *(long *)&this_01->field_0x8;
    local_98.d.d = *(Data **)(lVar3 + 0x260);
    local_98.d.ptr = *(char16_t **)(lVar3 + 0x268);
    local_98.d.size = *(undefined8 *)(lVar3 + 0x270);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar3 = *(long *)&this_01->field_0x8;
    local_b8.d.d = *(Data **)(lVar3 + 0x278);
    local_b8.d.ptr = *(char16_t **)(lVar3 + 0x280);
    local_b8.d.size = *(undefined8 *)(lVar3 + 0x288);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QWizardPage::pixmap((QWizardPage *)local_d0,which);
    QWizardPage::pixmap((QWizardPage *)local_e8,which);
    QWizardHeader::setup
              (this_00,&info,&local_98,&local_b8,(QPixmap *)local_d0,local_e8,this->titleFmt,
               this->subTitleFmt);
    QPixmap::~QPixmap(local_e8);
    QPixmap::~QPixmap((QPixmap *)local_d0);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar6 = info.watermark;
  if ((info.watermark != false) || (info.sideWidget == true)) {
    local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_b8);
    if (bVar6 != false) {
      if (this_01 == (QWidget *)0x0) {
        QPixmap::QPixmap((QPixmap *)local_d0,(QPixmap *)(*(long *)(lVar2 + 8) + 0x3c0));
      }
      else {
        QWizardPage::pixmap((QWizardPage *)local_d0,which);
      }
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)&local_98);
      local_98.d.size = local_b8.d.size;
      local_b8.d.size = (qsizetype)local_c0;
      local_98.d.d = (Data *)QDataStream::operator<<;
      local_c0 = (undefined1 *)0x0;
      QPixmap::~QPixmap((QPixmap *)&local_98);
      QPixmap::~QPixmap((QPixmap *)local_d0);
    }
    QLabel::setPixmap(&this->watermarkLabel->super_QLabel,(QPixmap *)&local_b8);
    QPixmap::~QPixmap((QPixmap *)&local_b8);
  }
  if (info.title == true) {
    QLabel::setTextFormat(this->titleLabel,this->titleFmt);
    pQVar5 = this->titleLabel;
    lVar2 = *(long *)&this_01->field_0x8;
    local_98.d.d = *(Data **)(lVar2 + 0x260);
    local_98.d.ptr = *(char16_t **)(lVar2 + 0x268);
    local_98.d.size = *(undefined8 *)(lVar2 + 0x270);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLabel::setText(pQVar5,&local_98);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (info.subTitle == true) {
    QLabel::setTextFormat(this->subTitleLabel,this->subTitleFmt);
    pQVar5 = this->subTitleLabel;
    lVar2 = *(long *)&this_01->field_0x8;
    local_98.d.d = *(Data **)(lVar2 + 0x278);
    local_98.d.ptr = *(char16_t **)(lVar2 + 0x280);
    local_98.d.size = *(undefined8 *)(lVar2 + 0x288);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLabel::setText(pQVar5,&local_98);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  enableUpdates(this);
  updateMinMaxSizes(this,&info);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updateLayout()
{
    Q_Q(QWizard);

    disableUpdates();

    QWizardLayoutInfo info = layoutInfoForCurrentPage();
    if (layoutInfo != info)
        recreateLayout(info);
    QWizardPage *page = q->currentPage();

    // If the page can expand vertically, let it stretch "infinitely" more
    // than the QSpacerItem at the bottom. Otherwise, let the QSpacerItem
    // stretch "infinitely" more than the page. Change the bottom item's
    // policy accordingly. The case that the page has no layout is basically
    // for Designer, only.
    if (page) {
        bool expandPage = !page->layout();
        if (!expandPage) {
            const QLayoutItem *pageItem = pageVBoxLayout->itemAt(pageVBoxLayout->indexOf(page));
            expandPage = pageItem->expandingDirections() & Qt::Vertical;
        }
        QSpacerItem *bottomSpacer = pageVBoxLayout->itemAt(pageVBoxLayout->count() -  1)->spacerItem();
        Q_ASSERT(bottomSpacer);
        bottomSpacer->changeSize(0, 0, QSizePolicy::Ignored, expandPage ? QSizePolicy::Ignored : QSizePolicy::MinimumExpanding);
        pageVBoxLayout->invalidate();
    }

    if (info.header) {
        Q_ASSERT(page);
        headerWidget->setup(info, page->title(), page->subTitle(),
                            page->pixmap(QWizard::LogoPixmap), page->pixmap(QWizard::BannerPixmap),
                            titleFmt, subTitleFmt);
    }

    if (info.watermark || info.sideWidget) {
        QPixmap pix;
        if (info.watermark) {
            if (page)
                pix = page->pixmap(QWizard::WatermarkPixmap);
            else
                pix = q->pixmap(QWizard::WatermarkPixmap);
        }
        watermarkLabel->setPixmap(pix); // in case there is no watermark and we show the side widget we need to clear the watermark
    }

    if (info.title) {
        Q_ASSERT(page);
        titleLabel->setTextFormat(titleFmt);
        titleLabel->setText(page->title());
    }
    if (info.subTitle) {
        Q_ASSERT(page);
        subTitleLabel->setTextFormat(subTitleFmt);
        subTitleLabel->setText(page->subTitle());
    }

    enableUpdates();
    updateMinMaxSizes(info);
}